

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

int SimpleBVH::BVH::max_node_index(int node_index,int b,int e)

{
  int iVar1;
  int e_00;
  
  if (e - b != 0 && b <= e) {
    if (b + 1 != e) {
      e_00 = (e - b) / 2 + b;
      iVar1 = max_node_index(node_index * 2,b,e_00);
      node_index = max_node_index(node_index * 2 + 1,e_00,e);
      if (node_index < iVar1) {
        node_index = iVar1;
      }
    }
    return node_index;
  }
  __assert_fail("e > b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                ,0xf9,"static int SimpleBVH::BVH::max_node_index(int, int, int)");
}

Assistant:

int BVH::max_node_index(int node_index, int b, int e)
{
    assert(e > b);
    if (b + 1 == e) {
        return node_index;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * node_index;
    int childr = 2 * node_index + 1;
    return std::max(max_node_index(childl, b, m), max_node_index(childr, m, e));
}